

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall Diligent::DeviceObjectArchive::Clear(DeviceObjectArchive *this)

{
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *local_c0;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  local_b8;
  DeviceObjectArchive *local_10;
  DeviceObjectArchive *this_local;
  
  local_10 = this;
  std::
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  ::clear(&this->m_NamedResources);
  local_c0 = local_b8._M_elems;
  do {
    memset(local_c0,0,0x18);
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::vector
              (local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 !=
           (vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)&local_10)
  ;
  std::array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  ::operator=(&this->m_DeviceShaders,&local_b8);
  std::array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  ::~array(&local_b8);
  RefCntAutoPtr<Diligent::IDataBlob>::Release(&this->m_pArchiveData);
  this->m_ContentVersion = 0;
  return;
}

Assistant:

void DeviceObjectArchive::Clear() noexcept
{
    m_NamedResources.clear();
    m_DeviceShaders = {};
    m_pArchiveData.Release();
    m_ContentVersion = 0;
}